

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3FinishCoding(Parse *pParse)

{
  sqlite3 *db_00;
  Schema *pSVar1;
  ExprList *pEVar2;
  Vdbe *p;
  VTable *zP4;
  ExprList *pEL;
  char *vtab;
  Schema *pSchema;
  int i;
  int iDb;
  Vdbe *v;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->nested == '\0') {
    if ((db_00->mallocFailed == '\0') && (pParse->nErr == 0)) {
      p = sqlite3GetVdbe(pParse);
      if (((p != (Vdbe *)0x0) && (sqlite3VdbeAddOp0(p,0x37), db_00->mallocFailed == '\0')) &&
         ((pParse->cookieMask != 0 || (pParse->pConstExpr != (ExprList *)0x0)))) {
        sqlite3VdbeJumpHere(p,0);
        for (pSchema._4_4_ = 0; pSchema._4_4_ < db_00->nDb; pSchema._4_4_ = pSchema._4_4_ + 1) {
          if ((pParse->cookieMask & 1 << ((byte)pSchema._4_4_ & 0x1f)) != 0) {
            sqlite3VdbeUsesBtree(p,pSchema._4_4_);
            pSVar1 = db_00->aDb[pSchema._4_4_].pSchema;
            sqlite3VdbeAddOp4Int
                      (p,2,pSchema._4_4_,
                       (uint)((pParse->writeMask & 1 << ((byte)pSchema._4_4_ & 0x1f)) != 0),
                       pSVar1->schema_cookie,pSVar1->iGeneration);
            if ((db_00->init).busy == '\0') {
              sqlite3VdbeChangeP5(p,1);
            }
          }
        }
        for (pSchema._0_4_ = 0; (int)pSchema < pParse->nVtabLock; pSchema._0_4_ = (int)pSchema + 1)
        {
          zP4 = sqlite3GetVTable(db_00,pParse->apVtabLock[(int)pSchema]);
          sqlite3VdbeAddOp4(p,0x99,0,0,0,(char *)zP4,-0xc);
        }
        pParse->nVtabLock = 0;
        codeTableLocks(pParse);
        sqlite3AutoincrementBegin(pParse);
        if (pParse->pConstExpr != (ExprList *)0x0) {
          pEVar2 = pParse->pConstExpr;
          pParse->okConstFactor = '\0';
          for (pSchema._0_4_ = 0; (int)pSchema < pEVar2->nExpr; pSchema._0_4_ = (int)pSchema + 1) {
            sqlite3ExprCode(pParse,pEVar2->a[(int)pSchema].pExpr,
                            pEVar2->a[(int)pSchema].u.iConstExprReg);
          }
        }
        sqlite3VdbeGoto(p,1);
      }
      if (((p == (Vdbe *)0x0) || (pParse->nErr != 0)) || (db_00->mallocFailed != '\0')) {
        pParse->rc = 1;
      }
      else {
        if ((pParse->pAinc != (AutoincInfo *)0x0) && (pParse->nTab == 0)) {
          pParse->nTab = 1;
        }
        sqlite3VdbeMakeReady(p,pParse);
        pParse->rc = 0x65;
      }
    }
    else if (pParse->rc == 0) {
      pParse->rc = 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FinishCoding(Parse *pParse){
  sqlite3 *db;
  Vdbe *v;

  assert( pParse->pToplevel==0 );
  db = pParse->db;
  if( pParse->nested ) return;
  if( db->mallocFailed || pParse->nErr ){
    if( pParse->rc==SQLITE_OK ) pParse->rc = SQLITE_ERROR;
    return;
  }

  /* Begin by generating some termination code at the end of the
  ** vdbe program
  */
  v = sqlite3GetVdbe(pParse);
  assert( !pParse->isMultiWrite 
       || sqlite3VdbeAssertMayAbort(v, pParse->mayAbort));
  if( v ){
    sqlite3VdbeAddOp0(v, OP_Halt);

#if SQLITE_USER_AUTHENTICATION
    if( pParse->nTableLock>0 && db->init.busy==0 ){
      sqlite3UserAuthInit(db);
      if( db->auth.authLevel<UAUTH_User ){
        sqlite3ErrorMsg(pParse, "user not authenticated");
        pParse->rc = SQLITE_AUTH_USER;
        return;
      }
    }
#endif

    /* The cookie mask contains one bit for each database file open.
    ** (Bit 0 is for main, bit 1 is for temp, and so forth.)  Bits are
    ** set for each database that is used.  Generate code to start a
    ** transaction on each used database and to verify the schema cookie
    ** on each used database.
    */
    if( db->mallocFailed==0 
     && (DbMaskNonZero(pParse->cookieMask) || pParse->pConstExpr)
    ){
      int iDb, i;
      assert( sqlite3VdbeGetOp(v, 0)->opcode==OP_Init );
      sqlite3VdbeJumpHere(v, 0);
      for(iDb=0; iDb<db->nDb; iDb++){
        Schema *pSchema;
        if( DbMaskTest(pParse->cookieMask, iDb)==0 ) continue;
        sqlite3VdbeUsesBtree(v, iDb);
        pSchema = db->aDb[iDb].pSchema;
        sqlite3VdbeAddOp4Int(v,
          OP_Transaction,                    /* Opcode */
          iDb,                               /* P1 */
          DbMaskTest(pParse->writeMask,iDb), /* P2 */
          pSchema->schema_cookie,            /* P3 */
          pSchema->iGeneration               /* P4 */
        );
        if( db->init.busy==0 ) sqlite3VdbeChangeP5(v, 1);
        VdbeComment((v,
              "usesStmtJournal=%d", pParse->mayAbort && pParse->isMultiWrite));
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
      for(i=0; i<pParse->nVtabLock; i++){
        char *vtab = (char *)sqlite3GetVTable(db, pParse->apVtabLock[i]);
        sqlite3VdbeAddOp4(v, OP_VBegin, 0, 0, 0, vtab, P4_VTAB);
      }
      pParse->nVtabLock = 0;
#endif

      /* Once all the cookies have been verified and transactions opened, 
      ** obtain the required table-locks. This is a no-op unless the 
      ** shared-cache feature is enabled.
      */
      codeTableLocks(pParse);

      /* Initialize any AUTOINCREMENT data structures required.
      */
      sqlite3AutoincrementBegin(pParse);

      /* Code constant expressions that where factored out of inner loops */
      if( pParse->pConstExpr ){
        ExprList *pEL = pParse->pConstExpr;
        pParse->okConstFactor = 0;
        for(i=0; i<pEL->nExpr; i++){
          sqlite3ExprCode(pParse, pEL->a[i].pExpr, pEL->a[i].u.iConstExprReg);
        }
      }

      /* Finally, jump back to the beginning of the executable code. */
      sqlite3VdbeGoto(v, 1);
    }
  }


  /* Get the VDBE program ready for execution
  */
  if( v && pParse->nErr==0 && !db->mallocFailed ){
    assert( pParse->iCacheLevel==0 );  /* Disables and re-enables match */
    /* A minimum of one cursor is required if autoincrement is used
    *  See ticket [a696379c1f08866] */
    if( pParse->pAinc!=0 && pParse->nTab==0 ) pParse->nTab = 1;
    sqlite3VdbeMakeReady(v, pParse);
    pParse->rc = SQLITE_DONE;
  }else{
    pParse->rc = SQLITE_ERROR;
  }
}